

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbitmap.cpp
# Opt level: O1

QBitmap * QBitmap::fromData(QBitmap *__return_storage_ptr__,QSize *size,uchar *bits,
                           Format monoFormat)

{
  int iVar1;
  QRgb QVar2;
  int iVar3;
  uchar *__dest;
  long lVar4;
  long in_FS_OFFSET;
  undefined1 local_68 [16];
  QImageData *local_58;
  QColor local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QImage::QImage((QImage *)local_68,size,monoFormat);
  QColor::QColor(&local_48,color0);
  QVar2 = QColor::rgb(&local_48);
  QImage::setColor((QImage *)local_68,0,QVar2);
  QColor::QColor(&local_48,color1);
  QVar2 = QColor::rgb(&local_48);
  QImage::setColor((QImage *)local_68,1,QVar2);
  if (0 < (size->ht).m_i) {
    iVar3 = (size->wd).m_i;
    iVar1 = iVar3 + 7;
    iVar3 = iVar3 + 0xe;
    if (-1 < iVar1) {
      iVar3 = iVar1;
    }
    lVar4 = 0;
    do {
      __dest = QImage::scanLine((QImage *)local_68,(int)lVar4);
      memcpy(__dest,bits,(long)(iVar3 >> 3));
      lVar4 = lVar4 + 1;
      bits = bits + (iVar3 >> 3);
    } while (lVar4 < (size->ht).m_i);
  }
  fromImage(__return_storage_ptr__,(QImage *)local_68,(ImageConversionFlags)0x0);
  QImage::~QImage((QImage *)local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QBitmap QBitmap::fromData(const QSize &size, const uchar *bits, QImage::Format monoFormat)
{
    Q_ASSERT(monoFormat == QImage::Format_Mono || monoFormat == QImage::Format_MonoLSB);

    QImage image(size, monoFormat);
    image.setColor(0, QColor(Qt::color0).rgb());
    image.setColor(1, QColor(Qt::color1).rgb());

    // Need to memcpy each line separately since QImage is 32bit aligned and
    // this data is only byte aligned...
    int bytesPerLine = (size.width() + 7) / 8;
    for (int y = 0; y < size.height(); ++y)
        memcpy(image.scanLine(y), bits + bytesPerLine * y, bytesPerLine);
    return QBitmap::fromImage(std::move(image));
}